

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

SegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *this,size_t pageCount)

{
  size_t *psVar1;
  undefined4 *puVar2;
  size_t sVar3;
  HANDLE pVVar4;
  code *pcVar5;
  bool bVar6;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_00;
  HANDLE pVVar7;
  long lVar8;
  undefined8 *in_FS_OFFSET;
  
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x4a6,"(!isClosed)","!isClosed");
    if (!bVar6) goto LAB_00259a34;
    *puVar2 = 0;
  }
  bVar6 = ValidThreadAccess(this);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x4a7,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar6) goto LAB_00259a34;
    *puVar2 = 0;
  }
  this->isUsed = true;
  this_00 = DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
            PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,unsigned_long,bool>
                      ((DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
                        *)&this->largeSegments,
                       (NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,this,pageCount,
                       this->enableWriteBarrier);
  if (this_00 != (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    bVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::Initialize
                      (this_00,this->allocFlags | 0x1000,this->excludeGuardPages);
    if (bVar6) {
      LogAllocSegment(this,1,this_00->segmentPageCount);
      sVar3 = this_00->segmentPageCount;
      lVar8 = sVar3 * 0x1000;
      this->usedBytes = this->usedBytes + lVar8;
      LOCK();
      totalUsedBytes = totalUsedBytes + lVar8;
      UNLOCK();
      if (maxUsedBytes < totalUsedBytes) {
        maxUsedBytes = totalUsedBytes;
      }
      if (this->memoryData != (PageMemoryData *)0x0) {
        psVar1 = &this->memoryData->allocPageCount;
        *psVar1 = *psVar1 + sVar3;
      }
      PageTracking::ReportAllocation
                ((PageAllocator *)this,this_00->address,this_00->segmentPageCount << 0xc);
      if (this->verifyEnabled != true) {
        return this_00;
      }
      pVVar4 = this->processHandle;
      pVVar7 = GetCurrentProcess();
      if (pVVar4 != pVVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x4c0,"(this->processHandle == GetCurrentProcess())",
                           "this->processHandle == GetCurrentProcess()");
        if (!bVar6) {
LAB_00259a34:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar2 = 0;
      }
      memset(this_00->address,0xca,this_00->segmentPageCount << 0xc);
      return this_00;
    }
    DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveHead<Memory::NoThrowHeapAllocator>
              (&this->largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
  }
  return (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
}

Assistant:

TSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocSegment(size_t pageCount)
{
    Assert(!isClosed);
    ASSERT_THREAD();

    // Even though we don't idle decommit large segments, we still need to consider these allocations
    // as using the page allocator
    this->isUsed = true;

    TSegment * segment = largeSegments.PrependNode(&NoThrowNoMemProtectHeapAllocator::Instance,
        this, pageCount, enableWriteBarrier);
    if (segment == nullptr)
    {
        return nullptr;
    }
    if (!segment->Initialize(MEM_COMMIT | allocFlags, excludeGuardPages))
    {
        largeSegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
        return nullptr;
    }

    LogAllocSegment(segment);
    LogAllocPages(segment->GetPageCount());

    PageTracking::ReportAllocation((PageAllocator*)this, segment->GetAddress(), AutoSystemInfo::PageSize * segment->GetPageCount());
#ifdef RECYCLER_MEMORY_VERIFY
    if (verifyEnabled)
    {
        Assert(this->processHandle == GetCurrentProcess());
        memset(segment->GetAddress(), Recycler::VerifyMemFill, AutoSystemInfo::PageSize * segment->GetPageCount());
    }
#endif

    return segment;
}